

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

UBool charIterTextAccess(UText *ut,int64_t index,UBool forward)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  UChar UVar4;
  int iVar5;
  bool bVar6;
  long lVar7;
  UChar *pUVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  long lStack_50;
  
  uVar9 = (uint)index;
  if ((int)uVar9 < 0) {
    if (forward == '\0') {
      uVar10 = 0;
      bVar3 = true;
      uVar9 = 0;
    }
    else {
      lVar11 = ut->a;
      uVar10 = 0;
      bVar6 = false;
LAB_002c7805:
      bVar3 = false;
      uVar9 = uVar10 - (byte)(lVar11 == (int)uVar10 & bVar6);
    }
  }
  else {
    lVar11 = ut->a;
    uVar10 = (uint)lVar11;
    if ((long)(ulong)(uVar9 & 0x7fffffff) < lVar11) {
      uVar10 = uVar9;
    }
    bVar6 = 0 < (int)uVar10;
    if ((int)uVar10 < 1 || forward != '\0') {
      if (forward != '\0') goto LAB_002c7805;
      bVar3 = true;
      uVar9 = uVar10;
    }
    else {
      bVar3 = true;
      uVar9 = uVar10 - 1;
    }
  }
  iVar12 = uVar9 - (int)uVar9 % 0x10;
  lVar7 = (long)iVar12;
  lVar11 = ut->chunkNativeStart;
  if (ut->chunkNativeStart == lVar7) goto LAB_002c790e;
  if (ut->b == iVar12) {
    lStack_50 = 0x50;
LAB_002c785f:
    pUVar8 = *(UChar **)((long)&ut->magic + lStack_50);
  }
  else {
    if (ut->c == iVar12) {
      lStack_50 = 0x58;
      goto LAB_002c785f;
    }
    plVar2 = (long *)ut->context;
    pUVar8 = (UChar *)ut->p;
    if (pUVar8 == ut->chunkContents) {
      pUVar8 = (UChar *)ut->q;
    }
    (**(code **)(*plVar2 + 0x78))(plVar2,iVar12);
    lVar11 = 0;
    do {
      if (lVar11 == 0x10) break;
      UVar4 = (**(code **)(*plVar2 + 0x28))(plVar2);
      pUVar8[lVar11] = UVar4;
      lVar1 = ~(long)((int)uVar9 % 0x10) + (long)(int)uVar9 + lVar11;
      lVar11 = lVar11 + 1;
    } while (lVar1 + 1 <= ut->a);
  }
  iVar5 = 0x10;
  ut->chunkContents = pUVar8;
  ut->chunkLength = 0x10;
  ut->chunkNativeStart = lVar7;
  ut->chunkNativeLimit = (long)(iVar12 + 0x10);
  lVar11 = ut->a;
  if (lVar11 < iVar12 + 0x10) {
    ut->chunkNativeLimit = lVar11;
    iVar5 = (int)lVar11 - iVar12;
    ut->chunkLength = iVar5;
  }
  ut->nativeIndexingLimit = iVar5;
  lVar11 = lVar7;
LAB_002c790e:
  iVar12 = uVar10 - (int)lVar11;
  ut->chunkOffset = iVar12;
  if (bVar3) {
    bVar3 = 0 < iVar12;
  }
  else {
    bVar3 = iVar12 < ut->chunkLength;
  }
  return bVar3;
}

Assistant:

static UBool U_CALLCONV
charIterTextAccess(UText *ut, int64_t index, UBool  forward) {
    CharacterIterator *ci   = (CharacterIterator *)ut->context;

    int32_t clippedIndex = (int32_t)index;
    if (clippedIndex<0) {
        clippedIndex=0;
    } else if (clippedIndex>=ut->a) {
        clippedIndex=(int32_t)ut->a;
    }
    int32_t neededIndex = clippedIndex;
    if (!forward && neededIndex>0) {
        // reverse iteration, want the position just before what was asked for.
        neededIndex--;
    } else if (forward && neededIndex==ut->a && neededIndex>0) {
        // Forward iteration, don't ask for something past the end of the text.
        neededIndex--;
    }

    // Find the native index of the start of the buffer containing what we want.
    neededIndex -= neededIndex % CIBufSize;

    UChar *buf = NULL;
    UBool  needChunkSetup = TRUE;
    int    i;
    if (ut->chunkNativeStart == neededIndex) {
        // The buffer we want is already the current chunk.
        needChunkSetup = FALSE;
    } else if (ut->b == neededIndex) {
        // The first buffer (buffer p) has what we need.
        buf = (UChar *)ut->p;
    } else if (ut->c == neededIndex) {
        // The second buffer (buffer q) has what we need.
        buf = (UChar *)ut->q;
    } else {
        // Neither buffer already has what we need.
        // Load new data from the character iterator.
        // Use the buf that is not the current buffer.
        buf = (UChar *)ut->p;
        if (ut->p == ut->chunkContents) {
            buf = (UChar *)ut->q;
        }
        ci->setIndex(neededIndex);
        for (i=0; i<CIBufSize; i++) {
            buf[i] = ci->nextPostInc();
            if (i+neededIndex > ut->a) {
                break;
            }
        }
    }

    // We have a buffer with the data we need.
    // Set it up as the current chunk, if it wasn't already.
    if (needChunkSetup) {
        ut->chunkContents = buf;
        ut->chunkLength   = CIBufSize;
        ut->chunkNativeStart = neededIndex;
        ut->chunkNativeLimit = neededIndex + CIBufSize;
        if (ut->chunkNativeLimit > ut->a) {
            ut->chunkNativeLimit = ut->a;
            ut->chunkLength  = (int32_t)(ut->chunkNativeLimit)-(int32_t)(ut->chunkNativeStart);
        }
        ut->nativeIndexingLimit = ut->chunkLength;
        U_ASSERT(ut->chunkOffset>=0 && ut->chunkOffset<=CIBufSize);
    }
    ut->chunkOffset = clippedIndex - (int32_t)ut->chunkNativeStart;
    UBool success = (forward? ut->chunkOffset<ut->chunkLength : ut->chunkOffset>0);
    return success;
}